

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessible.h
# Opt level: O0

void __thiscall
QAccessibleTableCellInterface::QAccessibleTableCellInterface(QAccessibleTableCellInterface *this)

{
  QAccessibleTableCellInterface *this_local;
  
  *(code **)this = QDragLeaveEvent::QDragLeaveEvent;
  return;
}

Assistant:

class Q_GUI_EXPORT QAccessibleTableCellInterface
{
public:
    virtual ~QAccessibleTableCellInterface();

    virtual bool isSelected() const = 0;

    virtual QList<QAccessibleInterface*> columnHeaderCells() const = 0;
    virtual QList<QAccessibleInterface*> rowHeaderCells() const = 0;
    virtual int columnIndex() const = 0;
    virtual int rowIndex() const = 0;
    virtual int columnExtent() const = 0;
    virtual int rowExtent() const = 0;

    virtual QAccessibleInterface* table() const = 0;
}